

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ComparatorDisposer::ComparatorDisposer
          (ComparatorDisposer *this,ComparatorContainer *comparators_,string *extensionWithDot,
          shared_ptr<ApprovalTests::ApprovalComparator> *previousComparator_,
          shared_ptr<ApprovalTests::ApprovalComparator> *newComparator)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
  *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  string *this_00;
  key_type *in_R8;
  key_type *__k;
  
  *in_RDI = 1;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  this_00 = (string *)(in_RDI + 0x10);
  __k = in_R8;
  ::std::__cxx11::string::string(this_00,in_RDX);
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)this_00,
             (shared_ptr<ApprovalTests::ApprovalComparator> *)in_R8);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
  ::operator[](in_RCX,__k);
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::operator=
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)this_00,
             (shared_ptr<ApprovalTests::ApprovalComparator> *)in_R8);
  return;
}

Assistant:

ComparatorDisposer::ComparatorDisposer(
        ComparatorContainer& comparators_,
        const std::string& extensionWithDot,
        std::shared_ptr<ApprovalTests::ApprovalComparator> previousComparator_,
        std::shared_ptr<ApprovalTests::ApprovalComparator> newComparator)
        : comparators(comparators_)
        , ext_(extensionWithDot)
        , previousComparator(std::move(previousComparator_))
    {
        comparators_[extensionWithDot] = std::move(newComparator);
    }